

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsComponentGetPart(FmsComponent comp,FmsInt part_id,FmsEntityType type,FmsDomain *domain,
                       FmsIntType *ent_id_type,void **ents,FmsOrientation **ent_orients,
                       FmsInt *num_ents)

{
  int iVar1;
  _FmsPart_private *p_Var2;
  
  if (comp == (FmsComponent)0x0) {
    return 1;
  }
  if (part_id < comp->num_parts) {
    if (type < FMS_NUM_ENTITY_TYPES) {
      p_Var2 = comp->parts + part_id;
      if (domain != (FmsDomain *)0x0) {
        *domain = p_Var2->domain;
      }
      if (ent_id_type != (FmsIntType *)0x0) {
        *ent_id_type = p_Var2->entities_ids_type[type];
      }
      if (ents != (void **)0x0) {
        *ents = p_Var2->entities_ids[type];
      }
      if (ent_orients != (FmsOrientation **)0x0) {
        *ent_orients = p_Var2->orientations[type];
      }
      if (num_ents == (FmsInt *)0x0) {
        return 0;
      }
      *num_ents = p_Var2->num_entities[type];
      return 0;
    }
    iVar1 = 3;
  }
  else {
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int FmsComponentGetPart(FmsComponent comp, FmsInt part_id, FmsEntityType type,
                        FmsDomain *domain, FmsIntType *ent_id_type,
                        const void **ents, const FmsOrientation **ent_orients,
                        FmsInt *num_ents) {
  if (!comp) { E_RETURN(1); }
  if (part_id >= comp->num_parts) { E_RETURN(2); }
  if (type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(3); }
  // if (FmsEntityDim[type] != comp->dim) { E_RETURN(4); }
  struct _FmsPart_private *part = &comp->parts[part_id];
  if (domain) { *domain = part->domain; }
  if (ent_id_type) { *ent_id_type = part->entities_ids_type[type]; }
  if (ents) { *ents = part->entities_ids[type]; }
  if (ent_orients) { *ent_orients = part->orientations[type]; }
  if (num_ents) { *num_ents = part->num_entities[type]; }
  return 0;
}